

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  xmlNodePtr pxVar6;
  xmlChar *pxVar7;
  xmlNodePtr cur;
  char *__format;
  bool bVar8;
  
  logfile = (FILE *)fopen64("runsuite.log","wb");
  if ((FILE *)logfile == (FILE *)0x0) {
    main_cold_1();
  }
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  ctxtXPath = (xmlXPathContextPtr_conflict)xmlXPathNewContext(0);
  if (ctxtXPath->cache != (void *)0x0) {
    xmlXPathContextSetCache(ctxtXPath,0,0xffffffff,0);
  }
  xmlXPathRegisterNs(ctxtXPath,"ts","TestSuite");
  xmlXPathRegisterNs(ctxtXPath,"xlink","http://www.w3.org/1999/xlink");
  xmlSetGenericErrorFunc(0,testErrorHandler);
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  xmlSchemaInitTypes();
  xmlRelaxNGInitTypes();
  if ((1 < argc) && (iVar3 = strcmp(argv[1],"-v"), iVar3 == 0)) {
    verbose = '\x01';
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  lVar5 = xmlReadFile("test/xsdtest/xsdtestsuite.xml",0,2);
  if (lVar5 == 0) {
    main_cold_3();
  }
  else {
    puts("## XML Schemas datatypes test suite from James Clark");
    pxVar6 = (xmlNodePtr)xmlDocGetRootElement(lVar5);
    if ((((pxVar6 == (xmlNodePtr)0x0) || (iVar4 = xmlStrEqual(pxVar6->name,"testSuite"), iVar4 == 0)
         ) || (pxVar6 = getNext(pxVar6,"./testSuite[1]"), pxVar6 == (xmlNodePtr)0x0)) ||
       (iVar4 = xmlStrEqual(pxVar6->name,"testSuite"), iVar4 == 0)) {
      main_cold_2();
    }
    else {
      do {
        xsdTestSuite(pxVar6);
        pxVar6 = getNext(pxVar6,"following-sibling::testSuite[1]");
      } while (pxVar6 != (xmlNodePtr)0x0);
    }
    xmlFreeDoc(lVar5);
  }
  printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
         (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)(nb_leaks - iVar2));
  if (nb_errors - iVar3 == 3) {
    printf("%d errors were expected\n",3);
  }
  else {
    printf("%d errors were expected, got %d errors\n",3);
    iVar3 = iVar3 + 1;
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  nb_errors = iVar3;
  lVar5 = xmlReadFile("test/relaxng/OASIS/spectest.xml",0,2);
  if (lVar5 == 0) {
    main_cold_5();
  }
  else {
    puts("## Relax NG test suite from James Clark");
    pxVar6 = (xmlNodePtr)xmlDocGetRootElement(lVar5);
    if (((pxVar6 == (xmlNodePtr)0x0) || (iVar4 = xmlStrEqual(pxVar6->name,"testSuite"), iVar4 == 0))
       || ((pxVar6 = getNext(pxVar6,"./testSuite[1]"), pxVar6 == (xmlNodePtr)0x0 ||
           (iVar4 = xmlStrEqual(pxVar6->name,"testSuite"), iVar4 == 0)))) {
      main_cold_4();
    }
    else {
      do {
        if (verbose == '\x01') {
          pxVar7 = getString(pxVar6,"string(documentation)");
          if (pxVar7 == (xmlChar *)0x0) {
            pxVar7 = getString(pxVar6,"string(section)");
            if (pxVar7 == (xmlChar *)0x0) goto LAB_00102b47;
            __format = "Section %s\n";
          }
          else {
            __format = "Suite %s\n";
          }
          printf(__format,pxVar7);
          (*_xmlFree)(pxVar7);
        }
LAB_00102b47:
        for (cur = getNext(pxVar6,"./testSuite[1]"); cur != (xmlNodePtr)0x0;
            cur = getNext(cur,"following-sibling::testSuite[1]")) {
          xsdTestSuite(cur);
        }
        pxVar6 = getNext(pxVar6,"following-sibling::testSuite[1]");
      } while (pxVar6 != (xmlNodePtr)0x0);
    }
    xmlFreeDoc(lVar5);
  }
  if (nb_leaks == iVar2 && nb_errors == iVar3) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  lVar5 = xmlReadFile("test/relaxng/testsuite.xml",0,2);
  if (lVar5 == 0) {
    main_cold_7();
  }
  else {
    puts("## Relax NG test suite for libxml2");
    pxVar6 = (xmlNodePtr)xmlDocGetRootElement(lVar5);
    if (((pxVar6 == (xmlNodePtr)0x0) || (iVar4 = xmlStrEqual(pxVar6->name,"testSuite"), iVar4 == 0))
       || ((pxVar6 = getNext(pxVar6,"./testSuite[1]"), pxVar6 == (xmlNodePtr)0x0 ||
           (iVar4 = xmlStrEqual(pxVar6->name,"testSuite"), iVar4 == 0)))) {
      main_cold_6();
    }
    else {
      do {
        xsdTestSuite(pxVar6);
        pxVar6 = getNext(pxVar6,"following-sibling::testSuite[1]");
      } while (pxVar6 != (xmlNodePtr)0x0);
    }
    xmlFreeDoc(lVar5);
  }
  if (nb_leaks == iVar2 && nb_errors == iVar3) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet","xstc/Tests/Metadata/");
  if (nb_leaks == iVar2 && nb_errors == iVar3) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if (nb_leaks == iVar2 && nb_errors == iVar3) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
    puts("Some errors were expected.");
    nb_errors = iVar3;
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if (nb_leaks == iVar2 && nb_errors == iVar3) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
    puts("Some errors were expected.");
    nb_errors = iVar3;
  }
  bVar8 = nb_errors != 0 || nb_leaks != 0;
  if (bVar8) {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return (uint)bVar8;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int ret = 0;
    int old_errors, old_tests, old_leaks, expected_errors;

    logfile = fopen(LOGFILE, "wb");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    if ((argc >= 2) && (!strcmp(argv[1], "-v")))
        verbose = 1;


    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xsdTest();
    expected_errors = 3;
    printf("Ran %d tests, %d errors, %d leaks\n",
           nb_tests - old_tests,
           nb_errors - old_errors,
           nb_leaks - old_leaks);
    if (nb_errors - old_errors == expected_errors) {
        printf("%d errors were expected\n", expected_errors);
        nb_errors = old_errors;
    } else {
        printf("%d errors were expected, got %d errors\n",
               expected_errors, nb_errors - old_errors);
        nb_errors = old_errors + 1;
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest1();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest2();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet",
		 "xstc/Tests/Metadata/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    else
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks)) {
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    } else {
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
        printf("Some errors were expected.\n");
        nb_errors = old_errors;
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks)) {
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    } else {
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
        printf("Some errors were expected.\n");
        nb_errors = old_errors;
    }

    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}